

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ResultBuilder * __thiscall
Catch::ExpressionLhs<bool>::captureExpression<(Catch::Internal::Operator)0,bool>
          (ExpressionLhs<bool> *this,bool *rhs)

{
  ResultBuilder *pRVar1;
  bool value;
  bool value_00;
  string local_88;
  string local_68;
  string local_48;
  allocator<char> local_21;
  
  pRVar1 = ResultBuilder::setResultType(this->m_rb,this->m_lhs == *rhs);
  Catch::toString_abi_cxx11_(&local_88,(Catch *)(ulong)this->m_lhs,value);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_88);
  Catch::toString_abi_cxx11_(&local_68,(Catch *)(ulong)*rhs,value_00);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"==",&local_21);
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }